

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binasc.cpp
# Opt level: O0

void checkOptions(Options *opts)

{
  Options *pOVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  allocator local_5e9;
  undefined1 local_5e8 [72];
  string local_5a0 [32];
  undefined1 local_580 [40];
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  undefined1 local_4e0 [72];
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  undefined1 local_420 [72];
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Options *local_10;
  Options *opts_local;
  
  local_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a|ascii=b",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Display only printable ASCII characters.",&local_69);
  smf::Options::define(opts,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"b|binary|bytes=b",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Display only byte hex codes.",&local_b9);
  smf::Options::define(pOVar1,(string *)local_90,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"c|compile=s:",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"Compile ASCII file into binary form.",&local_109);
  smf::Options::define(pOVar1,(string *)local_e0,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"man|manual=b",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"Print the manual.",&local_159);
  smf::Options::define(pOVar1,(string *)local_130,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"m|midi=b",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"Print binary data as MIDI file.",&local_1a9);
  smf::Options::define(pOVar1,(string *)local_180,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"mod=i:25",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Number of hex codes on a line.",&local_1f9);
  smf::Options::define(pOVar1,(string *)local_1d0,(string *)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"wrap=i:75",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"Number of characters on line for -a option",&local_249);
  smf::Options::define(pOVar1,(string *)local_220,(string *)local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"author=b",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"Author of the program.",&local_299);
  smf::Options::define(pOVar1,(string *)local_270,(string *)local_298);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"version=b",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"Version of the program.",&local_2e9);
  smf::Options::define(pOVar1,(string *)local_2c0,(string *)local_2e8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"example=b",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"Example usage of the program.",&local_339);
  smf::Options::define(pOVar1,(string *)local_310,(string *)local_338);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"help=b",&local_361);
  smf::Options::define(pOVar1,(string *)local_360);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  smf::Options::process(local_10,1,0);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"a",&local_389);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_388);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"b",&local_3b1);
  bVar3 = smf::Options::getBoolean(pOVar1,(string *)local_3b0);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"c",(allocator *)(local_420 + 0x47));
  bVar4 = smf::Options::getBoolean(pOVar1,(string *)local_3d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_420 + 0x47));
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  pOVar1 = local_10;
  if (1 < (byte)(bVar2 + bVar3 + bVar4)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Error: only one of the opts -a, -b, or -c can be usedat one time.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    smf::Options::getCommand_abi_cxx11_((Options *)local_420);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_420 + 0x20),pcVar7,&local_421);
    usage((string *)(local_420 + 0x20));
    std::__cxx11::string::~string((string *)(local_420 + 0x20));
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string((string *)local_420);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"author",&local_449);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_448);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  pOVar1 = local_10;
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar6 = std::operator<<(poVar6,"craig@ccrma.stanford.edu, April 1997");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"version",&local_471);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_470);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  pOVar1 = local_10;
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"version: Wed Apr 11 12:39:39 PDT 2018");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"compiled:    ");
    poVar6 = std::operator<<(poVar6,"Apr 26 2025");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"help",(allocator *)(local_4e0 + 0x47));
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_498);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)(local_4e0 + 0x47));
  pOVar1 = local_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_((Options *)local_4e0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_4e0 + 0x20),pcVar7,&local_4e1);
    usage((string *)(local_4e0 + 0x20));
    std::__cxx11::string::~string((string *)(local_4e0 + 0x20));
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::__cxx11::string::~string((string *)local_4e0);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"example",&local_509);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_508);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  pOVar1 = local_10;
  if (bVar2) {
    example();
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"manual",&local_531);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_530);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  pOVar1 = local_10;
  if (bVar2) {
    manual();
    exit(0);
  }
  std::allocator<char>::allocator();
  local_5e8[0x46] = 0;
  local_5e8[0x45] = 0;
  local_5e8[0x44] = 0;
  std::__cxx11::string::string(local_558,"compile",(allocator *)(local_580 + 0x27));
  bVar3 = smf::Options::getBoolean(pOVar1,(string *)local_558);
  pOVar1 = local_10;
  bVar2 = false;
  if (bVar3) {
    std::allocator<char>::allocator();
    local_5e8[0x46] = 1;
    std::__cxx11::string::string(local_5a0,"compile",(allocator *)(local_5e8 + 0x47));
    local_5e8[0x45] = 1;
    smf::Options::getString((Options *)local_580,(string *)pOVar1);
    local_5e8[0x44] = 1;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    sVar8 = strlen(pcVar7);
    bVar2 = sVar8 == 0;
  }
  if ((local_5e8[0x44] & 1) != 0) {
    std::__cxx11::string::~string((string *)local_580);
  }
  if ((local_5e8[0x45] & 1) != 0) {
    std::__cxx11::string::~string(local_5a0);
  }
  if ((local_5e8[0x46] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(local_5e8 + 0x47));
  }
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)(local_580 + 0x27));
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Error: you must specify an output file when using the -c option");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  iVar5 = smf::Options::getArgCount(local_10);
  if (0 < iVar5) {
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Error: you must specify at least one file on the command-line");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  smf::Options::getCommand_abi_cxx11_((Options *)local_5e8);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_5e8 + 0x20),pcVar7,&local_5e9);
  usage((string *)(local_5e8 + 0x20));
  std::__cxx11::string::~string((string *)(local_5e8 + 0x20));
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string((string *)local_5e8);
  exit(1);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("a|ascii=b",       "Display only printable ASCII characters."  );
	opts.define("b|binary|bytes=b","Display only byte hex codes."              );
	opts.define("c|compile=s:",    "Compile ASCII file into binary form."      );
	opts.define("man|manual=b",    "Print the manual."                         );
	opts.define("m|midi=b",        "Print binary data as MIDI file."           );
	opts.define("mod=i:25",        "Number of hex codes on a line."            );
	opts.define("wrap=i:75",       "Number of characters on line for -a option");
	opts.define("author=b",        "Author of the program."                    );
	opts.define("version=b",       "Version of the program."                   );
	opts.define("example=b",       "Example usage of the program."             );
	opts.define("help=b");
	opts.process();

	if (opts.getBoolean("a") + opts.getBoolean("b") +
			opts.getBoolean("c") > 1) {
		cerr << "Error: only one of the opts -a, -b, or -c can be used"
	           "at one time." << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, April 1997" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "version: Wed Apr 11 12:39:39 PDT 2018" << endl;
		cout << "compiled:    " << __DATE__ << endl;
		exit(0);
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}
	if (opts.getBoolean("manual")) {
		manual();
		exit(0);
	}

	if (opts.getBoolean("compile") &&
		strlen(opts.getString("compile").c_str()) == 0) {
		cerr << "Error: you must specify an output file when using the -c option"
			  << endl;
		exit(1);
	}

	if (opts.getArgCount() < 1) {
		cerr << "Error: you must specify at least one file on the command-line"
			  << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}
}